

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

bool __thiscall
fmt::v9::detail::compute_width::count_code_points::operator()
          (count_code_points *this,uint32_t cp,string_view param_2)

{
  type tVar1;
  int value;
  
  if (cp < 0x1100) {
    value = 1;
  }
  else {
    value = 2;
    if (1 < cp - 0x2329 && 0x115f < cp) {
      if ((((((0x34f < cp - 0x1f300) && (0xfffd < (cp & 0xfffefffe) - 0x20000)) && (6 < cp - 0xffe0)
            ) && ((0x60 < cp - 0xff00 && (0x3f < cp - 0xfe30)))) &&
          ((9 < cp - 0xfe10 && ((0x1ff < cp - 0xf900 && (0x2ba3 < cp - 0xac00)))))) &&
         (cp == 0x303f || 0x764f < cp - 0x2e80)) {
        value = ((cp & 0xffffff00) == 0x1f900) + 1;
      }
    }
  }
  tVar1 = to_unsigned<int>(value);
  *this->count = *this->count + (ulong)tVar1;
  return true;
}

Assistant:

FMT_CONSTEXPR auto operator()(uint32_t cp, string_view) const -> bool {
      *count += detail::to_unsigned(
          1 +
          (cp >= 0x1100 &&
           (cp <= 0x115f ||  // Hangul Jamo init. consonants
            cp == 0x2329 ||  // LEFT-POINTING ANGLE BRACKET
            cp == 0x232a ||  // RIGHT-POINTING ANGLE BRACKET
            // CJK ... Yi except IDEOGRAPHIC HALF FILL SPACE:
            (cp >= 0x2e80 && cp <= 0xa4cf && cp != 0x303f) ||
            (cp >= 0xac00 && cp <= 0xd7a3) ||    // Hangul Syllables
            (cp >= 0xf900 && cp <= 0xfaff) ||    // CJK Compatibility Ideographs
            (cp >= 0xfe10 && cp <= 0xfe19) ||    // Vertical Forms
            (cp >= 0xfe30 && cp <= 0xfe6f) ||    // CJK Compatibility Forms
            (cp >= 0xff00 && cp <= 0xff60) ||    // Fullwidth Forms
            (cp >= 0xffe0 && cp <= 0xffe6) ||    // Fullwidth Forms
            (cp >= 0x20000 && cp <= 0x2fffd) ||  // CJK
            (cp >= 0x30000 && cp <= 0x3fffd) ||
            // Miscellaneous Symbols and Pictographs + Emoticons:
            (cp >= 0x1f300 && cp <= 0x1f64f) ||
            // Supplemental Symbols and Pictographs:
            (cp >= 0x1f900 && cp <= 0x1f9ff))));
      return true;
    }